

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManFindDerive(Gia_Man_t *pNew,int nOuts,Vec_Int_t *vIns,Vec_Wec_t *vCofs,Vec_Int_t *vMap)

{
  int w;
  int iVar1;
  int nCtrl;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  ulong *pTruth;
  Gia_Obj_t *pObj;
  ulong uVar6;
  ulong uVar7;
  Vec_Int_t *p_04;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  
  p = Vec_IntAlloc(0x10000);
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntStart(vCofs->nSize);
  p_02 = Vec_IntAlloc(10);
  p_03 = Vec_IntAlloc(vCofs->nSize);
  iVar2 = vIns->nSize;
  uVar14 = 1 << ((byte)iVar2 - 6 & 0x1f);
  if (iVar2 < 7) {
    uVar14 = 1;
  }
  pTruth = (ulong *)malloc((long)(int)uVar14 << 3);
  iVar1 = Vec_IntFindMax(vMap);
  nCtrl = Abc_Base2Log(iVar1 + 1);
  if (iVar2 <= nCtrl) {
    __assert_fail("nBits < Vec_IntSize(vIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44c,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (vMap->nSize != vCofs->nSize) {
    __assert_fail("Vec_IntSize(vMap) == Vec_WecSize(vCofs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44d,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (vMap->nSize != 1 << ((byte)iVar2 & 0x1f)) {
    __assert_fail("Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44e,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + 1) {
    iVar2 = Vec_IntEntry(vIns,iVar13);
    pObj = Gia_ManCi(pNew,iVar2);
    iVar2 = Gia_ObjToLit(pNew,pObj);
    Vec_IntPush(p_00,iVar2);
    iVar2 = vIns->nSize;
  }
  uVar10 = 0;
  uVar7 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar7 = uVar10;
  }
  iVar2 = 0;
  if (0 < nCtrl) {
    iVar2 = nCtrl;
  }
  for (; (int)uVar10 != iVar2; uVar10 = (ulong)((int)uVar10 + 1)) {
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pTruth[uVar6] = 0;
    }
    for (uVar14 = 0; (int)uVar14 < vMap->nSize; uVar14 = uVar14 + 1) {
      uVar3 = Vec_IntEntry(vMap,uVar14);
      if ((uVar3 & 1 << ((byte)uVar10 & 0x1f)) != 0) {
        pTruth[uVar14 >> 6] = pTruth[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
      }
    }
    uVar14 = vIns->nSize;
    if (nCtrl < 6) {
      if ((int)uVar14 < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x489,"word Abc_Tt6Stretch(word, int)");
      }
      uVar3 = uVar14;
      if (uVar14 < 3) {
        uVar3 = 3;
      }
      uVar8 = uVar3;
      if (uVar3 == 3) {
        uVar8 = 4;
      }
      uVar4 = uVar8;
      if (uVar8 == 4) {
        uVar4 = 5;
      }
      if (1 < uVar4 - 5) {
        __assert_fail("nVars == 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x496,"word Abc_Tt6Stretch(word, int)");
      }
      uVar11 = (uint)*pTruth;
      uVar12 = -(uVar11 & 1);
      if (uVar14 != 0) {
        uVar12 = uVar11;
      }
      uVar12 = (uVar12 & 3) * 5;
      if (1 < uVar14) {
        uVar12 = uVar11;
      }
      uVar6 = (ulong)(uVar12 & 0xf) * 0x11;
      if (2 < uVar14) {
        uVar6 = *pTruth;
      }
      uVar9 = (uVar6 & 0xff) * 0x101;
      if (uVar3 != 3) {
        uVar9 = uVar6;
      }
      uVar6 = (uVar9 & 0xffff) * 0x10001;
      if (uVar8 != 4) {
        uVar6 = uVar9;
      }
      uVar9 = (uVar6 & 0xffffffff) * 0x100000001;
      if (uVar4 != 5) {
        uVar9 = uVar6;
      }
      *pTruth = uVar9;
    }
    iVar13 = Kit_TruthToGia(pNew,(uint *)pTruth,uVar14,p,p_00,1);
    Vec_IntPush(p_02,iVar13);
  }
  iVar2 = 0;
  while( true ) {
    if (iVar1 < iVar2) {
      iVar1 = 1 << ((byte)nCtrl & 0x1f);
      iVar2 = 0;
      if (nOuts < 1) {
        nOuts = 0;
      }
      while( true ) {
        if (iVar2 == nOuts) {
          free(pTruth);
          Vec_IntFree(p_01);
          Vec_IntFree(p_02);
          Vec_IntFree(p_03);
          Vec_IntFree(p_00);
          Vec_IntFree(p);
          return;
        }
        p_03->nSize = 0;
        for (iVar13 = 0; iVar13 < vCofs->nSize; iVar13 = iVar13 + 1) {
          p_04 = Vec_WecEntry(vCofs,iVar13);
          iVar5 = Vec_IntEntry(p_01,iVar13);
          if (iVar5 != 0) {
            iVar5 = Vec_IntEntry(p_04,iVar2);
            Vec_IntPush(p_03,iVar5);
          }
        }
        while (p_03->nSize < iVar1) {
          Vec_IntPush(p_03,0);
        }
        if (p_03->nSize != iVar1) break;
        if (p_02->nSize != nCtrl) {
          __assert_fail("Vec_IntSize(vBits) == nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                        ,0x46c,
                        "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                       );
        }
        iVar13 = Gia_ManFindMuxTree_rec(pNew,p_02->pArray,nCtrl,p_03,0);
        Gia_ManAppendCo(pNew,iVar13);
        iVar2 = iVar2 + 1;
      }
      __assert_fail("Vec_IntSize(vData) == (1 << nBits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                    ,0x46b,
                    "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
    uVar7 = (ulong)(uint)vMap->nSize;
    if (vMap->nSize < 1) {
      uVar7 = 0;
    }
    uVar10 = 0;
    while( true ) {
      if (uVar7 == uVar10) goto LAB_001ff4a9;
      if (vMap->pArray[uVar10] == iVar2) break;
      uVar10 = uVar10 + 1;
    }
    if (vCofs->nSize <= (int)uVar10) break;
    Vec_IntWriteEntry(p_01,(int)uVar10,1);
    iVar2 = iVar2 + 1;
  }
LAB_001ff4a9:
  __assert_fail("Cof >= 0 && Cof < Vec_WecSize(vCofs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,0x45f,
                "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManFindDerive( Gia_Man_t * pNew, int nOuts, Vec_Int_t * vIns, Vec_Wec_t * vCofs, Vec_Int_t * vMap )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves = Vec_IntAlloc( 100 );
    Vec_Int_t * vUsed = Vec_IntStart( Vec_WecSize(vCofs) );
    Vec_Int_t * vBits = Vec_IntAlloc( 10 );
    Vec_Int_t * vData = Vec_IntAlloc( Vec_WecSize(vCofs) );
    int nWords = Abc_TtWordNum(Vec_IntSize(vIns));
    word * pTruth = ABC_ALLOC( word, nWords );
    int nValues = Vec_IntFindMax(vMap)+1;
    int i, k, Value, nBits = Abc_Base2Log(nValues);
    assert( nBits < Vec_IntSize(vIns) );
    assert( Vec_IntSize(vMap) == Vec_WecSize(vCofs) );
    assert( Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns)) );
    Vec_IntForEachEntry( vIns, Value, i )
        Vec_IntPush( vLeaves, Gia_ObjToLit(pNew, Gia_ManCi(pNew, Value)) );
    for ( i = 0; i < nBits; i++ )
    {
        Abc_TtClear( pTruth, nWords );
        Vec_IntForEachEntry( vMap, Value, k )
            if ( (Value >> i) & 1 )
                Abc_TtSetBit( pTruth, k );
        if ( nBits < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], Vec_IntSize(vIns) );
        Vec_IntPush( vBits, Kit_TruthToGia(pNew, (unsigned*)pTruth, Vec_IntSize(vIns), vMemory, vLeaves, 1) );
        //printf( "Bit %d : ", i ); Dau_DsdPrintFromTruth( pTruth, Vec_IntSize(vIns) );
    }
    for ( i = 0; i < nValues; i++ )
    {
        int Cof = Vec_IntFind(vMap, i);
        assert( Cof >= 0 && Cof < Vec_WecSize(vCofs) );
        Vec_IntWriteEntry( vUsed, Cof, 1 );
    }
    for ( i = 0; i < nOuts; i++ )
    {
        Vec_Int_t * vLevel;
        Vec_IntClear( vData );
        Vec_WecForEachLevel( vCofs, vLevel, k )
            if ( Vec_IntEntry(vUsed, k) )
                Vec_IntPush( vData, Vec_IntEntry(vLevel, i) );
        while ( Vec_IntSize(vData) < (1 << nBits) )
            Vec_IntPush( vData, 0 );
        assert( Vec_IntSize(vData) == (1 << nBits) );
        assert( Vec_IntSize(vBits) == nBits );
        Value = Gia_ManFindMuxTree_rec( pNew, Vec_IntArray(vBits), Vec_IntSize(vBits), vData, 0 );
        Gia_ManAppendCo( pNew, Value );
    }
    ABC_FREE( pTruth );
    Vec_IntFree( vUsed );
    Vec_IntFree( vBits );
    Vec_IntFree( vData );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vMemory );
}